

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screrror.cpp
# Opt level: O3

void __thiscall
CompileScriptException::CopyInto(CompileScriptException *this,CompileScriptException *pse)

{
  int32 iVar1;
  UINT len;
  BSTR pWVar2;
  
  iVar1 = (this->super_ScriptException).ichLim;
  (pse->super_ScriptException).ichMin = (this->super_ScriptException).ichMin;
  (pse->super_ScriptException).ichLim = iVar1;
  CopyException(&(pse->super_ScriptException).ei,&(this->super_ScriptException).ei);
  iVar1 = this->ichMinLine;
  pse->line = this->line;
  pse->ichMinLine = iVar1;
  pse->hasLineNumberInfo = this->hasLineNumberInfo;
  pWVar2 = this->bstrLine;
  if (pWVar2 != (BSTR)0x0) {
    len = SysStringLen(pWVar2);
    pWVar2 = SysAllocStringLen(pWVar2,len);
    pse->bstrLine = pWVar2;
  }
  return;
}

Assistant:

void CompileScriptException::CopyInto(CompileScriptException* pse)
{
    ScriptException::CopyInto(pse);

    pse->line = this->line;
    pse->ichMinLine = this->ichMinLine;
    pse->hasLineNumberInfo = this->hasLineNumberInfo;

    if (this->bstrLine)
    {
        pse->bstrLine = SysAllocStringLen(this->bstrLine, SysStringLen(this->bstrLine));
    }
}